

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strFindFirst_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  UBool UVar1;
  UChar *pUVar2;
  long lVar3;
  UChar *pUVar4;
  UChar c;
  long lVar5;
  
  if (subLength < -1 || sub == (UChar *)0x0) {
    return s;
  }
  if (length < -1 || s == (UChar *)0x0) {
    return (UChar *)0x0;
  }
  if ((subLength & length) < 0) {
    c = *sub;
    if (c == L'\0') {
      return s;
    }
    pUVar2 = s;
    if (((c & 0xf800U) == 0xd800) || (sub[1] != L'\0')) {
LAB_003550be:
      do {
        do {
          pUVar4 = pUVar2;
          if (*pUVar4 == L'\0') {
            return (UChar *)0x0;
          }
          pUVar2 = pUVar4 + 1;
        } while (*pUVar4 != c);
        for (lVar5 = 2; *(short *)((long)sub + lVar5) != 0; lVar5 = lVar5 + 2) {
          if (*(short *)((long)pUVar4 + lVar5) == 0) {
            return (UChar *)0x0;
          }
          if (*(short *)((long)pUVar4 + lVar5) != *(short *)((long)sub + lVar5)) goto LAB_003550be;
        }
        UVar1 = isMatchAtCPBoundary(s,pUVar4,(UChar *)(lVar5 + (long)pUVar4),(UChar *)0x0);
        if (UVar1 != '\0') {
          return pUVar4;
        }
      } while( true );
    }
  }
  else {
    if (subLength < 0) {
      subLength = u_strlen_63(sub);
    }
    if (subLength == 0) {
      return s;
    }
    c = *sub;
    if ((c & 0xf800U) == 0xd800 || subLength + -1 != 0) {
      lVar5 = (long)(subLength + -1);
      if (length < 0) {
        pUVar2 = s;
LAB_0035510e:
        do {
          do {
            pUVar4 = pUVar2;
            if (*pUVar4 == L'\0') {
              return (UChar *)0x0;
            }
            pUVar2 = pUVar4 + 1;
            lVar3 = 2;
          } while (*pUVar4 != c);
          for (; lVar5 * -2 + lVar3 != 2; lVar3 = lVar3 + 2) {
            if (*(short *)((long)pUVar4 + lVar3) == 0) {
              return (UChar *)0x0;
            }
            if (*(short *)((long)pUVar4 + lVar3) != *(short *)((long)sub + lVar3))
            goto LAB_0035510e;
          }
          UVar1 = isMatchAtCPBoundary(s,pUVar4,(UChar *)(lVar3 + (long)pUVar4),(UChar *)0x0);
          if (UVar1 != '\0') {
            return pUVar4;
          }
        } while( true );
      }
      if (length < subLength) {
        return (UChar *)0x0;
      }
      pUVar2 = s;
LAB_00354fdc:
      do {
        do {
          pUVar4 = pUVar2;
          if (pUVar4 == s + (uint)length + -lVar5) {
            return (UChar *)0x0;
          }
          pUVar2 = pUVar4 + 1;
          lVar3 = 2;
        } while (*pUVar4 != c);
        for (; lVar5 * -2 + lVar3 != 2; lVar3 = lVar3 + 2) {
          if (*(short *)((long)pUVar4 + lVar3) != *(short *)((long)sub + lVar3)) goto LAB_00354fdc;
        }
        UVar1 = isMatchAtCPBoundary(s,pUVar4,(UChar *)(lVar3 + (long)pUVar4),s + (uint)length);
        if (UVar1 != '\0') {
          return pUVar4;
        }
      } while( true );
    }
    if (-1 < length) {
      pUVar2 = u_memchr_63(s,c,length);
      return pUVar2;
    }
  }
  pUVar2 = u_strchr_63(s,c);
  return pUVar2;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindFirst(const UChar *s, int32_t length,
               const UChar *sub, int32_t subLength) {
    const UChar *start, *p, *q, *subLimit;
    UChar c, cs, cq;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    start=s;

    if(length<0 && subLength<0) {
        /* both strings are NUL-terminated */
        if((cs=*sub++)==0) {
            return (UChar *)s;
        }
        if(*sub==0 && !U16_IS_SURROGATE(cs)) {
            /* the substring consists of a single, non-surrogate BMP code point */
            return u_strchr(s, cs);
        }

        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if((cq=*q)==0) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=cq) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }

        /* not found */
        return NULL;
    }

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[0] to search for it fast */
    cs=*sub++;
    --subLength;
    subLimit=sub+subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strchr(s, cs) : u_memchr(s, cs, length);
    }

    if(length<0) {
        /* s is NUL-terminated */
        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    } else {
        const UChar *limit, *preLimit;

        /* subLength was decremented above */
        if(length<=subLength) {
            return NULL; /* s is shorter than sub */
        }

        limit=s+length;

        /* the substring must start before preLimit */
        preLimit=limit-subLength;

        while(s!=preLimit) {
            c=*s++;
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, limit)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if(*p!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    }

    /* not found */
    return NULL;
}